

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

bool __thiscall
el::base::TypedConfigurations::unsafeValidateFileRolling
          (TypedConfigurations *this,Level level,PreRollOutCallback *preRollOutCallback)

{
  __shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  *this_00;
  element_type *peVar1;
  unsigned_long uVar2;
  size_t sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  char *in_RDX;
  function<void_(const_char_*,_unsigned_long)> *in_RDI;
  string fname;
  size_t currFileSize;
  size_t maxLogFileSize;
  fstream_t *fs;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  char *in_stack_ffffffffffffffa0;
  fstream_t *in_stack_ffffffffffffffa8;
  Level in_stack_ffffffffffffffb4;
  TypedConfigurations *in_stack_ffffffffffffffb8;
  bool local_1;
  
  this_00 = &unsafeGetConfigByRef<std::shared_ptr<std::fstream>>
                       (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                        (unordered_map<el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>_>
                         *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0)->
             super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
  peVar1 = utils::std::
           __shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ::get(this_00);
  if (peVar1 == (element_type *)0x0) {
    local_1 = true;
  }
  else {
    uVar2 = unsafeGetConfigByVal<unsigned_long>
                      (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                       (unordered_map<el::Level,_unsigned_long,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
                        *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    sVar3 = utils::File::getSizeOfFile(in_stack_ffffffffffffffa8);
    if ((uVar2 == 0) || (sVar3 < uVar2)) {
      local_1 = false;
    }
    else {
      pbVar4 = unsafeGetConfigByRef<std::__cxx11::string>
                         (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                          (unordered_map<el::Level,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      std::__cxx11::string::string((string *)&stack0xffffffffffffffa8,(string *)pbVar4);
      std::fstream::close();
      std::__cxx11::string::c_str();
      utils::std::function<void_(const_char_*,_unsigned_long)>::operator()
                (in_RDI,in_RDX,CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      utils::std::operator|(_S_out,_S_trunc);
      std::fstream::open((string *)peVar1,(_Ios_Openmode)&stack0xffffffffffffffa8);
      local_1 = true;
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
    }
  }
  return local_1;
}

Assistant:

bool TypedConfigurations::unsafeValidateFileRolling(Level level, const PreRollOutCallback& preRollOutCallback) {
  base::type::fstream_t* fs = unsafeGetConfigByRef(level, &m_fileStreamMap, "fileStream").get();
  if (fs == nullptr) {
    return true;
  }
  std::size_t maxLogFileSize = unsafeGetConfigByVal(level, &m_maxLogFileSizeMap, "maxLogFileSize");
  std::size_t currFileSize = base::utils::File::getSizeOfFile(fs);
  if (maxLogFileSize != 0 && currFileSize >= maxLogFileSize) {
    std::string fname = unsafeGetConfigByRef(level, &m_filenameMap, "filename");
    ELPP_INTERNAL_INFO(1, "Truncating log file [" << fname << "] as a result of configurations for level ["
                       << LevelHelper::convertToString(level) << "]");
    fs->close();
    preRollOutCallback(fname.c_str(), currFileSize);
    fs->open(fname, std::fstream::out | std::fstream::trunc);
    return true;
  }
  return false;
}